

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

Node * __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::CharacterClassPass1<false>
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this)

{
  undefined1 *puVar1;
  uint32 *this_00;
  long lVar2;
  code *pcVar3;
  byte bVar4;
  CharBitvec *this_01;
  undefined2 uVar5;
  EncodedChar **ppEVar6;
  ulong uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  codepoint_t codePointValue;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  undefined4 *puVar16;
  long *plVar17;
  Node *pNVar18;
  Node *pNVar19;
  AltNode *pAVar20;
  AltNode *pAVar21;
  Char CVar22;
  ulong uVar23;
  ArenaAllocator *pAVar24;
  uint32 *puVar25;
  uint uVar26;
  long lVar27;
  EncodedChar EVar28;
  Parser<UTF8EncodingPolicyBase<false>,_false> *pPVar29;
  uint totalCount;
  int iVar30;
  uint uVar31;
  NodeTag *pNVar32;
  AltNode *lastAltNode;
  char16 local_920 [4];
  CharSet<unsigned_int> negatedSet;
  codepoint_t lowerCharOfRange;
  undefined1 local_3d0 [8];
  MatchSetNode deferredSetNode;
  CharSet<unsigned_int> codePointSet;
  OLECHAR local_88;
  Char local_5c;
  Parser<UTF8EncodingPolicyBase<false>,_false> *pPStack_58;
  codepoint_t upperCharOfRange;
  uint32 *local_50;
  bool local_45;
  Char local_44;
  bool previousWasASurrogate;
  EncodedChar **ppEStack_40;
  EncodedChar local_31;
  
  CharSet<unsigned_int>::CharSet
            ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6));
  deferredSetNode.super_Node._vptr_Node._0_4_ = 0xb;
  deferredSetNode.super_Node._vptr_Node._4_4_ =
       deferredSetNode.super_Node._vptr_Node._4_4_ & 0xffff8000;
  deferredSetNode.super_Node.tag = Empty;
  deferredSetNode.super_Node.features = 0;
  deferredSetNode.super_Node._12_4_ = 0;
  deferredSetNode.super_Node.firstSet = (CharSet<char16_t> *)0x0;
  deferredSetNode.super_Node.followSet._0_4_ = 0;
  deferredSetNode.super_Node._28_8_ = 0xffffffff;
  deferredSetNode.super_Node.prevConsumes.upper = 0xffffffff;
  deferredSetNode.super_Node.thisConsumes.lower = 0;
  deferredSetNode.super_Node.thisConsumes.upper = 0xffffffff;
  local_3d0 = (undefined1  [8])&PTR_LiteralLength_01558fd0;
  deferredSetNode.super_Node.followConsumes.lower._0_2_ = 0x100;
  CharSet<char16_t>::CharSet((CharSet<char16_t> *)&deferredSetNode.isNegation);
  codePointSet.characterPlanes[0x10].rep._32_8_ = &PTR_LiteralLength_01558ef0;
  if (this->inputLim < this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar8) goto LAB_00ee0c81;
    *puVar16 = 0;
  }
  ppEStack_40 = &this->next;
  local_31 = **ppEStack_40;
  if (local_31 == '^') {
    if (this->inputLim < *ppEStack_40 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar16 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar8) goto LAB_00ee0c81;
      *puVar16 = 0;
    }
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    if ((char)**ppEStack_40 < '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar16 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd6,"(!this->IsMultiUnitChar(next[i]))","!this->IsMultiUnitChar(next[i])"
                        );
      if (!bVar8) goto LAB_00ee0c81;
      *puVar16 = 0;
    }
    *ppEStack_40 = *ppEStack_40 + 1;
  }
  if (this->inputLim < this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar16 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar8) goto LAB_00ee0c81;
    *puVar16 = 0;
  }
  EVar28 = *this->next;
  local_45 = false;
  pPStack_58 = this;
  puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  local_44 = 0xffffffff;
  local_50 = (uint32 *)((long)&deferredSetNode.set.rep + 0x20);
  uVar26 = 0xffffffff;
  bVar10 = false;
  bVar8 = false;
  do {
    ppEVar6 = ppEStack_40;
    pPVar29 = pPStack_58;
    CVar22 = uVar26;
    if (EVar28 == '-') {
      if (uVar26 != 0xffffffff && local_44 == 0xffffffff) {
        if (pPStack_58->inputLim < pPStack_58->next + 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar9) goto LAB_00ee0c81;
          *puVar16 = 0;
        }
        if ((*ppEVar6)[1] != ']') {
          if (pPVar29->inputLim < *ppEVar6 + 1) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar16 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
            if (!bVar9) goto LAB_00ee0c81;
            *puVar16 = 0;
          }
          if ((char)**ppEVar6 < '\0') {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar16 = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                               ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                               "!this->IsMultiUnitChar(next[i])");
            if (!bVar9) goto LAB_00ee0c81;
            *puVar16 = 0;
          }
          *ppEVar6 = *ppEVar6 + 1;
          CVar22 = 0xffffffff;
          bVar4 = 0;
          local_44 = uVar26;
          goto LAB_00edfb4e;
        }
      }
      if (pPVar29->inputLim < pPVar29->next + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar16 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar9) goto LAB_00ee0c81;
        *puVar16 = 0;
      }
      if ((char)**ppEVar6 < '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar16 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                           "!this->IsMultiUnitChar(next[i])");
        if (!bVar9) goto LAB_00ee0c81;
        *puVar16 = 0;
      }
      *ppEVar6 = *ppEVar6 + 1;
      bVar4 = 0;
      uVar26 = 0x2d;
    }
    else {
      if (EVar28 == '\\') {
        if (pPStack_58->inputLim < pPStack_58->next + 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar9) goto LAB_00ee0c81;
          *puVar16 = 0;
        }
        if ((char)**ppEVar6 < '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd6,"(!this->IsMultiUnitChar(next[i]))",
                             "!this->IsMultiUnitChar(next[i])");
          if (!bVar9) goto LAB_00ee0c81;
          *puVar16 = 0;
        }
        pPVar29->next = pPVar29->next + 1;
        pNVar18 = ClassEscapePass1(pPVar29,(MatchCharNode *)
                                           (codePointSet.characterPlanes[0x10].rep.full.direct.vec +
                                           6),(MatchSetNode *)local_3d0,&local_45);
        if (pNVar18->tag == MatchSet) {
          if (local_44 != 0xffffffff) {
            if (pPVar29->unicodeFlagPresent == true) {
              Fail(pPVar29,-0x7ff5e9d3);
            }
            CharSet<unsigned_int>::SetRange
                      ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                       pPVar29->ctAllocator,0x2d,0x2d);
          }
          CharSet<unsigned_int>::UnionInPlace
                    ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                     pPVar29->ctAllocator,(CharSet<char16_t> *)&deferredSetNode.isNegation);
          local_44 = 0xffffffff;
          bVar4 = 1;
          uVar26 = 0xffffffff;
          goto LAB_00edfb4e;
        }
        local_88 = L'\0';
      }
      else {
        if (EVar28 == ']') {
          if (uVar26 != 0xffffffff) {
            CharSet<unsigned_int>::SetRange
                      ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                       pPStack_58->ctAllocator,uVar26,uVar26);
          }
          if (pPVar29->unicodeFlagPresent != false) {
            if (((pPVar29->scriptContext->config).threadConfig)->m_ES6Unicode == false) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar16 = 1;
              bVar8 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                 ,0x8e9,
                                 "(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())",
                                 "scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled()");
              if (!bVar8) goto LAB_00ee0c81;
              *puVar16 = 0;
            }
            if (deferredSetNode.set.rep._32_8_ != 1) goto LAB_00edfeb7;
            plVar17 = (long *)((long)&codePointSet.characterPlanes[0].rep + 0x20);
            uVar7 = 0;
            break;
          }
          if (deferredSetNode.set.rep._32_8_ - 1 < 5) {
            uVar11 = (int)deferredSetNode.set.rep._32_8_ - 1;
          }
          else if (deferredSetNode.set.rep._32_8_ == 0) {
            uVar11 = CharBitvec::Count((CharBitvec *)&codePointSet);
          }
          else {
            if (((undefined8 *)deferredSetNode.set.rep._32_8_ != &CharSetFull::Instance) &&
               (uVar26 = (**(code **)(*(long *)deferredSetNode.set.rep._32_8_ + 0x58))
                                   (deferredSetNode.set.rep._32_8_,2), 0xff00 < uVar26)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar16 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar16 = 1;
              bVar8 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                                 ,0x252,
                                 "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                                 ,
                                 "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                                );
              if (!bVar8) goto LAB_00ee0c81;
              *puVar16 = 0;
            }
            uVar11 = CharBitvec::Count((CharBitvec *)&codePointSet);
            if ((undefined8 *)deferredSetNode.set.rep._32_8_ == &CharSetFull::Instance) {
              iVar30 = 0xff00;
            }
            else {
              iVar30 = (**(code **)(*(long *)deferredSetNode.set.rep._32_8_ + 0x58))
                                 (deferredSetNode.set.rep._32_8_,2);
            }
            uVar11 = iVar30 + uVar11;
          }
          ppEStack_40 = (EncodedChar **)__tls_get_addr(&PTR_0155fe48);
          lVar27 = 0;
          uVar14 = 0;
          goto LAB_00ee0612;
        }
        if (pPStack_58->inputLim <= pPStack_58->next) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x25d,"(!IsEOF())","!IsEOF()");
          if (!bVar9) goto LAB_00ee0c81;
          *puVar16 = 0;
        }
        local_88 = UTF8EncodingPolicyBase<false>::ReadFull<true>
                             (&pPVar29->super_UTF8EncodingPolicyBase<false>,ppEVar6,
                              pPVar29->inputLim);
      }
      bVar4 = 0;
      uVar26 = (uint)(ushort)local_88;
    }
LAB_00edfb4e:
    if (!(bool)(~bVar10 & CVar22 == 0xffffffff)) {
      if (bVar10) {
        if (pPVar29->unicodeFlagPresent == true) {
          Fail(pPVar29,-0x7ff5e9d3);
        }
        if (uVar26 != 0xffffffff) {
          CharSet<unsigned_int>::SetRange
                    ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                     pPVar29->ctAllocator,uVar26,uVar26);
        }
        pAVar24 = pPVar29->ctAllocator;
        uVar26 = 0x2d;
        CVar22 = 0x2d;
      }
      else {
        if (local_44 == 0xffffffff) {
          CharSet<unsigned_int>::SetRange
                    ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                     pPVar29->ctAllocator,CVar22,CVar22);
          local_44 = 0xffffffff;
          goto LAB_00edfc36;
        }
        if (uVar26 < local_44) {
          if (pPVar29->unicodeFlagPresent == true) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar16 = 1;
            bVar10 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                                ,0x8bd,"(!unicodeFlagPresent)","!unicodeFlagPresent");
            if (!bVar10) goto LAB_00ee0c81;
            *puVar16 = 0;
          }
          Fail(pPVar29,-0x7ff5ec63);
        }
        pAVar24 = pPVar29->ctAllocator;
        CVar22 = local_44;
      }
      CharSet<unsigned_int>::SetRange
                ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),pAVar24,
                 CVar22,uVar26);
      local_44 = 0xffffffff;
      uVar26 = 0xffffffff;
    }
LAB_00edfc36:
    if (pPVar29->inputLim < pPVar29->next) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar16 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                          ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar10) goto LAB_00ee0c81;
      *puVar16 = 0;
    }
    EVar28 = **ppEStack_40;
    bVar10 = bVar8;
    bVar8 = (bool)(bVar4 & EVar28 == '-');
  } while( true );
  while( true ) {
    lVar27 = *plVar17;
    plVar17 = plVar17 + 5;
    uVar7 = uVar23 + 1;
    if (lVar27 != 1) break;
    uVar23 = uVar7;
    if (uVar23 == 0x10) break;
  }
  if (0xf < uVar23) {
    pNVar18 = (Node *)new<Memory::ArenaAllocator>(0x68,pPVar29->ctAllocator,0x366bee);
    pNVar18->tag = MatchSet;
    pNVar18->features = 0;
    *(uint *)&pNVar18->field_0xc = *(uint *)&pNVar18->field_0xc & 0xffff8000;
    pNVar18->firstSet = (CharSet<char16_t> *)0x0;
    pNVar18->followSet = (CharSet<char16_t> *)0x0;
    (pNVar18->prevConsumes).lower = 0;
    *(undefined8 *)&(pNVar18->prevConsumes).upper = 0xffffffff;
    *(undefined8 *)&(pNVar18->thisConsumes).upper = 0xffffffff;
    (pNVar18->followConsumes).upper = 0xffffffff;
    pNVar18->_vptr_Node = (_func_int **)&PTR_LiteralLength_01558fd0;
    *(undefined2 *)&pNVar18[1]._vptr_Node = 0x100;
    CharSet<char16_t>::CharSet((CharSet<char16_t> *)&pNVar18[1].tag);
    return pNVar18;
  }
LAB_00edfeb7:
  if ((local_31 != '^') && (pPVar29->caseInsensitiveFlagPresent == false)) {
    ppEStack_40 = (EncodedChar **)__tls_get_addr(&PTR_0155fe48);
    lVar27 = 0;
    iVar30 = 0;
    do {
      lVar2 = *(long *)((long)codePointSet.characterPlanes + lVar27 + -8);
      if (lVar2 - 1U < 5) {
        uVar11 = (int)lVar2 - 1;
      }
      else {
        plVar17 = *(long **)((long)codePointSet.characterPlanes + lVar27 + -8);
        if (plVar17 == (long *)0x0) {
          uVar11 = CharBitvec::Count((CharBitvec *)
                                     ((long)&codePointSet.characterPlanes[0].rep + lVar27));
        }
        else {
          if ((plVar17 != &CharSetFull::Instance) &&
             (uVar26 = (**(code **)(*plVar17 + 0x58))(plVar17,2), 0xff00 < uVar26)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            ppEVar6 = ppEStack_40;
            *(undefined4 *)ppEStack_40 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                               ,0x252,
                               "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                               ,
                               "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                              );
            if (!bVar8) goto LAB_00ee0c81;
            *(undefined4 *)ppEVar6 = 0;
          }
          uVar11 = CharBitvec::Count((CharBitvec *)
                                     ((long)&codePointSet.characterPlanes[0].rep + lVar27));
          plVar17 = *(long **)((long)codePointSet.characterPlanes + lVar27 + -8);
          if (plVar17 == &CharSetFull::Instance) {
            iVar12 = 0xff00;
          }
          else {
            iVar12 = (**(code **)(*plVar17 + 0x58))(plVar17,2);
          }
          uVar11 = iVar12 + uVar11;
        }
      }
      pPVar29 = pPStack_58;
      iVar30 = iVar30 + uVar11;
      lVar27 = lVar27 + 0x28;
    } while (lVar27 != 0x2a8);
    if (iVar30 == 1) {
      codePointValue =
           CharSet<unsigned_int>::Singleton
                     ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6));
      if (codePointValue < 0x10000) {
        pNVar18 = (Node *)new<Memory::ArenaAllocator>(0x48,pPVar29->ctAllocator,0x366bee);
        pNVar18->tag = MatchChar;
        pNVar18->features = 0;
        *(uint *)&pNVar18->field_0xc = *(uint *)&pNVar18->field_0xc & 0xffff8000;
        pNVar18->firstSet = (CharSet<char16_t> *)0x0;
        pNVar18->followSet = (CharSet<char16_t> *)0x0;
        (pNVar18->prevConsumes).lower = 0;
        *(undefined8 *)&(pNVar18->prevConsumes).upper = 0xffffffff;
        *(undefined8 *)&(pNVar18->thisConsumes).upper = 0xffffffff;
        (pNVar18->followConsumes).upper = 0xffffffff;
        pNVar18->_vptr_Node = (_func_int **)&PTR_LiteralLength_01558ef0;
        *(undefined1 *)&pNVar18[1].tag = Empty;
        *(short *)&pNVar18[1]._vptr_Node = (short)codePointValue;
        lVar27 = 0x1d;
        do {
          *(short *)((long)&pNVar18->_vptr_Node + lVar27 * 2) = (short)codePointValue;
          lVar27 = lVar27 + 1;
        } while (lVar27 != 0x20);
      }
      else {
        if (pPVar29->unicodeFlagPresent == false) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          ppEVar6 = ppEStack_40;
          *(undefined4 *)ppEStack_40 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x902,"(unicodeFlagPresent)","unicodeFlagPresent");
          if (!bVar8) goto LAB_00ee0c81;
          *(undefined4 *)ppEVar6 = 0;
        }
        Js::NumberUtilities::CodePointAsSurrogatePair
                  (codePointValue,local_920,
                   (char16 *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8));
        pNVar18 = CreateSurrogatePairAtom
                            (pPVar29,local_920[0],
                             negatedSet.characterPlanes[0x10].rep.full.direct.vec[6]._0_2_);
      }
      CharSet<unsigned_int>::Clear
                ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                 pPVar29->ctAllocator);
      return pNVar18;
    }
  }
  CharSet<unsigned_int>::CharSet((CharSet<unsigned_int> *)local_920);
  if (pPVar29->caseInsensitiveFlagPresent == false) {
    if (local_31 == '^') {
      CharSet<unsigned_int>::ToComplement
                ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                 pPVar29->ctAllocator,(CharSet<unsigned_int> *)local_920);
      local_50 = (uint32 *)local_920;
    }
    puVar25 = local_50;
    if (local_31 == '^') {
      CharSet<unsigned_int>::FreeBody
                ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                 pPVar29->ctAllocator);
      puVar25 = local_50;
    }
  }
  else {
    puVar25 = negatedSet.characterPlanes[0x10].rep.full.direct.vec + 6;
    CharSet<unsigned_int>::CharSet((CharSet<unsigned_int> *)puVar25);
    CharSet<unsigned_int>::ToEquivClass
              ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
               pPVar29->ctAllocator,(CharSet<unsigned_int> *)puVar25);
    ppEStack_40 = (EncodedChar **)__tls_get_addr(&PTR_0155fe48);
    lVar27 = 0;
    uVar26 = 0;
    do {
      lVar2 = *(long *)((long)&negatedSet.characterPlanes[0x10].rep + lVar27 + 0x20);
      if (lVar2 - 1U < 5) {
        uVar11 = (int)lVar2 - 1;
      }
      else {
        plVar17 = *(long **)((long)&negatedSet.characterPlanes[0x10].rep + lVar27 + 0x20);
        if (plVar17 == (long *)0x0) {
          uVar11 = CharBitvec::Count((CharBitvec *)((long)&lowerCharOfRange + lVar27));
        }
        else {
          if ((plVar17 != &CharSetFull::Instance) &&
             (uVar31 = (**(code **)(*plVar17 + 0x58))(plVar17,2), 0xff00 < uVar31)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            ppEVar6 = ppEStack_40;
            *(undefined4 *)ppEStack_40 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                               ,0x252,
                               "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                               ,
                               "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                              );
            if (!bVar8) goto LAB_00ee0c81;
            *(undefined4 *)ppEVar6 = 0;
          }
          uVar11 = CharBitvec::Count((CharBitvec *)((long)&lowerCharOfRange + lVar27));
          plVar17 = *(long **)((long)&negatedSet.characterPlanes[0x10].rep + lVar27 + 0x20);
          if (plVar17 == &CharSetFull::Instance) {
            iVar30 = 0xff00;
          }
          else {
            iVar30 = (**(code **)(*plVar17 + 0x58))(plVar17,2);
          }
          uVar11 = iVar30 + uVar11;
        }
      }
      uVar26 = uVar26 + uVar11;
      lVar27 = lVar27 + 0x28;
    } while (lVar27 != 0x2a8);
    lVar27 = 0;
    uVar31 = 0;
    do {
      lVar2 = *(long *)((long)codePointSet.characterPlanes + lVar27 + -8);
      if (lVar2 - 1U < 5) {
        uVar11 = (int)lVar2 - 1;
      }
      else {
        plVar17 = *(long **)((long)codePointSet.characterPlanes + lVar27 + -8);
        if (plVar17 == (long *)0x0) {
          uVar11 = CharBitvec::Count((CharBitvec *)
                                     ((long)&codePointSet.characterPlanes[0].rep + lVar27));
        }
        else {
          if ((plVar17 != &CharSetFull::Instance) &&
             (uVar13 = (**(code **)(*plVar17 + 0x58))(plVar17,2), 0xff00 < uVar13)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            ppEVar6 = ppEStack_40;
            *(undefined4 *)ppEStack_40 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                               ,0x252,
                               "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                               ,
                               "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                              );
            if (!bVar8) goto LAB_00ee0c81;
            *(undefined4 *)ppEVar6 = 0;
          }
          uVar11 = CharBitvec::Count((CharBitvec *)
                                     ((long)&codePointSet.characterPlanes[0].rep + lVar27));
          plVar17 = *(long **)((long)codePointSet.characterPlanes + lVar27 + -8);
          if (plVar17 == &CharSetFull::Instance) {
            iVar30 = 0xff00;
          }
          else {
            iVar30 = (**(code **)(*plVar17 + 0x58))(plVar17,2);
          }
          uVar11 = iVar30 + uVar11;
        }
      }
      pPVar29 = pPStack_58;
      uVar31 = uVar31 + uVar11;
      lVar27 = lVar27 + 0x28;
    } while (lVar27 != 0x2a8);
    if (uVar26 < uVar31) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      ppEVar6 = ppEStack_40;
      *(undefined4 *)ppEStack_40 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x925,"(caseEquivalent.Count() >= codePointSet.Count())",
                         "caseEquivalent.Count() >= codePointSet.Count()");
      if (!bVar8) goto LAB_00ee0c81;
      *(undefined4 *)ppEVar6 = 0;
    }
    if (local_31 == '^') {
      puVar25 = deferredSetNode.set.rep.full.direct.vec + 6;
      CharSet<unsigned_int>::Clear((CharSet<unsigned_int> *)puVar25,pPVar29->ctAllocator);
      this_00 = negatedSet.characterPlanes[0x10].rep.full.direct.vec + 6;
      CharSet<unsigned_int>::ToComplement
                ((CharSet<unsigned_int> *)this_00,pPVar29->ctAllocator,
                 (CharSet<unsigned_int> *)puVar25);
      CharSet<unsigned_int>::FreeBody((CharSet<unsigned_int> *)this_00,pPVar29->ctAllocator);
    }
    else {
      CharSet<unsigned_int>::CloneFrom
                ((CharSet<unsigned_int> *)(deferredSetNode.set.rep.full.direct.vec + 6),
                 pPVar29->ctAllocator,
                 (CharSet<unsigned_int> *)(negatedSet.characterPlanes[0x10].rep.full.direct.vec + 6)
                );
      puVar25 = deferredSetNode.set.rep.full.direct.vec + 6;
    }
  }
  ppEStack_40 = (EncodedChar **)__tls_get_addr(&PTR_0155fe48);
  this_01 = (CharBitvec *)(puVar25 + 2);
  lVar27 = 0;
  uVar11 = 0;
  local_50 = puVar25;
  do {
    if (*(long *)((long)puVar25 + lVar27) - 1U < 5) {
      uVar14 = (int)*(long *)((long)puVar25 + lVar27) - 1;
    }
    else {
      plVar17 = *(long **)((long)puVar25 + lVar27);
      if (plVar17 == (long *)0x0) {
        uVar14 = CharBitvec::Count((CharBitvec *)((long)this_01->vec + lVar27));
      }
      else {
        if ((plVar17 != &CharSetFull::Instance) &&
           (uVar26 = (**(code **)(*plVar17 + 0x58))(plVar17,2), 0xff00 < uVar26)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          ppEVar6 = ppEStack_40;
          *(undefined4 *)ppEStack_40 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x252,
                             "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                             ,
                             "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                            );
          if (!bVar8) goto LAB_00ee0c81;
          *(undefined4 *)ppEVar6 = 0;
        }
        uVar14 = CharBitvec::Count((CharBitvec *)((long)this_01->vec + lVar27));
        plVar17 = *(long **)((long)local_50 + lVar27);
        if (plVar17 == &CharSetFull::Instance) {
          iVar30 = 0xff00;
        }
        else {
          iVar30 = (**(code **)(*plVar17 + 0x58))(plVar17,2);
        }
        uVar14 = iVar30 + uVar14;
        puVar25 = local_50;
      }
    }
    uVar11 = uVar11 + uVar14;
    lVar27 = lVar27 + 0x28;
  } while (lVar27 != 0x2a8);
  if (*(long *)puVar25 - 1U < 5) {
    uVar14 = (int)*(long *)puVar25 - 1;
  }
  else {
    plVar17 = *(long **)puVar25;
    if (plVar17 == (long *)0x0) {
      uVar14 = CharBitvec::Count(this_01);
    }
    else {
      if ((plVar17 != &CharSetFull::Instance) &&
         (uVar26 = (**(code **)(*plVar17 + 0x58))(plVar17,2), 0xff00 < uVar26)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        ppEVar6 = ppEStack_40;
        *(undefined4 *)ppEStack_40 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                           ,0x252,
                           "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                           ,
                           "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                          );
        if (!bVar8) goto LAB_00ee0c81;
        *(undefined4 *)ppEVar6 = 0;
      }
      uVar14 = CharBitvec::Count(this_01);
      plVar17 = *(long **)local_50;
      if (plVar17 == &CharSetFull::Instance) {
        iVar30 = 0xff00;
      }
      else {
        iVar30 = (**(code **)(*plVar17 + 0x58))(plVar17,2);
      }
      uVar14 = iVar30 + uVar14;
      puVar25 = local_50;
    }
  }
  pPVar29 = pPStack_58;
  if (uVar11 != uVar14) {
    if (uVar14 == 0) {
      pNVar19 = (Node *)0x0;
      pNVar18 = (Node *)0x0;
    }
    else {
      negatedSet.characterPlanes[0x10].rep.full.direct.vec[6]._0_2_ = 0xffff;
      local_5c = local_5c & 0xffff0000;
      bVar8 = CharSet<char16_t>::GetNextRange
                        ((CharSet<char16_t> *)local_50,L'\xd800',
                         (Char *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8),
                         (Char *)&local_5c);
      uVar5 = negatedSet.characterPlanes[0x10].rep.full.direct.vec[6]._0_2_;
      pNVar18 = (Node *)new<Memory::ArenaAllocator>(0x68,pPVar29->ctAllocator,0x366bee);
      pNVar18->tag = MatchSet;
      pNVar18->features = 0;
      *(uint *)&pNVar18->field_0xc = *(uint *)&pNVar18->field_0xc & 0xffff8000;
      pNVar18->firstSet = (CharSet<char16_t> *)0x0;
      pNVar18->followSet = (CharSet<char16_t> *)0x0;
      (pNVar18->prevConsumes).lower = 0;
      *(undefined8 *)&(pNVar18->prevConsumes).upper = 0xffffffff;
      *(undefined8 *)&(pNVar18->thisConsumes).upper = 0xffffffff;
      (pNVar18->followConsumes).upper = 0xffffffff;
      pNVar18->_vptr_Node = (_func_int **)&PTR_LiteralLength_01558fd0;
      *(undefined2 *)&pNVar18[1]._vptr_Node = 0x100;
      pNVar32 = &pNVar18[1].tag;
      CharSet<char16_t>::CharSet((CharSet<char16_t> *)pNVar32);
      puVar25 = local_50;
      if ((bVar8) && ((ushort)uVar5 < 0xe000)) {
        CharSet<unsigned_int>::CloneNonSurrogateCodeUnitsTo
                  ((CharSet<unsigned_int> *)local_50,pPVar29->ctAllocator,
                   (CharSet<char16_t> *)pNVar32);
        pNVar19 = (Node *)new<Memory::ArenaAllocator>(0x68,pPVar29->ctAllocator,0x366bee);
        pNVar19->tag = MatchSet;
        pNVar19->features = 0;
        *(uint *)&pNVar19->field_0xc = *(uint *)&pNVar19->field_0xc & 0xffff8000;
        pNVar19->firstSet = (CharSet<char16_t> *)0x0;
        pNVar19->followSet = (CharSet<char16_t> *)0x0;
        (pNVar19->prevConsumes).lower = 0;
        *(undefined8 *)&(pNVar19->prevConsumes).upper = 0xffffffff;
        *(undefined8 *)&(pNVar19->thisConsumes).upper = 0xffffffff;
        (pNVar19->followConsumes).upper = 0xffffffff;
        pNVar19->_vptr_Node = (_func_int **)&PTR_LiteralLength_01558fd0;
        *(undefined2 *)&pNVar19[1]._vptr_Node = 0x100;
        CharSet<char16_t>::CharSet((CharSet<char16_t> *)&pNVar19[1].tag);
        CharSet<unsigned_int>::CloneSurrogateCodeUnitsTo
                  ((CharSet<unsigned_int> *)puVar25,pPVar29->ctAllocator,
                   (CharSet<char16_t> *)&pNVar19[1].tag);
      }
      else {
        CharSet<unsigned_int>::CloneSimpleCharsTo
                  ((CharSet<unsigned_int> *)local_50,pPVar29->ctAllocator,
                   (CharSet<char16_t> *)pNVar32);
        pNVar19 = (Node *)0x0;
      }
    }
    if (pPVar29->unicodeFlagPresent == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      ppEVar6 = ppEStack_40;
      *(undefined4 *)ppEStack_40 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0x954,"(unicodeFlagPresent)","unicodeFlagPresent");
      if (!bVar8) goto LAB_00ee0c81;
      *(undefined4 *)ppEVar6 = 0;
    }
    if (pNVar18 == (Node *)0x0) {
      pAVar20 = (AltNode *)0x0;
    }
    else {
      pAVar20 = (AltNode *)new<Memory::ArenaAllocator>(0x60,pPVar29->ctAllocator,0x366bee);
      (pAVar20->super_Node).tag = Alt;
      (pAVar20->super_Node).features = 0;
      puVar1 = &(pAVar20->super_Node).field_0xc;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
      (pAVar20->super_Node).firstSet = (CharSet<char16_t> *)0x0;
      (pAVar20->super_Node).followSet = (CharSet<char16_t> *)0x0;
      (pAVar20->super_Node).prevConsumes.lower = 0;
      *(undefined8 *)&(pAVar20->super_Node).prevConsumes.upper = 0xffffffff;
      *(undefined8 *)&(pAVar20->super_Node).thisConsumes.upper = 0xffffffff;
      (pAVar20->super_Node).followConsumes.upper = 0xffffffff;
      (pAVar20->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01559190;
      pAVar20->head = pNVar18;
      pAVar20->switchSize = 0;
      pAVar20->tail = (AltNode *)0x0;
      pAVar20->runtimeTrie = (RuntimeCharTrie *)0x0;
      *(undefined8 *)((long)&pAVar20->runtimeTrie + 5) = 0;
    }
    negatedSet.characterPlanes[0x10].rep.full.direct.vec[6] = 0;
    local_5c = 0;
    bVar8 = CharSet<unsigned_int>::GetNextRange
                      ((CharSet<unsigned_int> *)local_50,0x10000,
                       (Char *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8),&local_5c)
    ;
    ppEVar6 = ppEStack_40;
    lastAltNode = pAVar20;
    if (bVar8) {
      do {
        if (negatedSet.characterPlanes[0x10].rep.full.direct.vec[6] == local_5c) {
          pAVar21 = AppendSurrogatePairToDisjunction
                              (pPVar29,negatedSet.characterPlanes[0x10].rep.full.direct.vec[6],
                               lastAltNode);
        }
        else {
          pAVar21 = AppendSurrogateRangeToDisjunction
                              (pPVar29,negatedSet.characterPlanes[0x10].rep.full.direct.vec[6],
                               local_5c,lastAltNode);
        }
        if (pAVar20 == (AltNode *)0x0) {
          pAVar20 = pAVar21;
        }
        if (pAVar21 == (AltNode *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)ppEVar6 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0x96a,"(currentTail != nullptr)","currentTail != nullptr");
          if (!bVar8) goto LAB_00ee0c81;
          *(undefined4 *)ppEVar6 = 0;
        }
        do {
          lastAltNode = pAVar21;
          pAVar21 = lastAltNode->tail;
        } while (lastAltNode->tail != (AltNode *)0x0);
        bVar8 = CharSet<unsigned_int>::GetNextRange
                          ((CharSet<unsigned_int> *)local_50,local_5c + 1,
                           (Char *)(negatedSet.characterPlanes[0x10].rep.compact.padding + 8),
                           &local_5c);
        pPVar29 = pPStack_58;
      } while (bVar8);
    }
    if (pNVar19 != (Node *)0x0) {
      pAVar21 = (AltNode *)new<Memory::ArenaAllocator>(0x60,pPVar29->ctAllocator,0x366bee);
      (pAVar21->super_Node).tag = Alt;
      (pAVar21->super_Node).features = 0;
      puVar1 = &(pAVar21->super_Node).field_0xc;
      *(uint *)puVar1 = *(uint *)puVar1 & 0xffff8000;
      (pAVar21->super_Node).firstSet = (CharSet<char16_t> *)0x0;
      (pAVar21->super_Node).followSet = (CharSet<char16_t> *)0x0;
      (pAVar21->super_Node).prevConsumes.lower = 0;
      *(undefined8 *)&(pAVar21->super_Node).prevConsumes.upper = 0xffffffff;
      *(undefined8 *)&(pAVar21->super_Node).thisConsumes.upper = 0xffffffff;
      (pAVar21->super_Node).followConsumes.upper = 0xffffffff;
      (pAVar21->super_Node)._vptr_Node = (_func_int **)&PTR_LiteralLength_01559190;
      pAVar21->head = pNVar19;
      pAVar21->switchSize = 0;
      pAVar21->tail = (AltNode *)0x0;
      pAVar21->runtimeTrie = (RuntimeCharTrie *)0x0;
      *(undefined8 *)((long)&pAVar21->runtimeTrie + 5) = 0;
      lastAltNode->tail = pAVar21;
    }
    CharSet<unsigned_int>::Clear((CharSet<unsigned_int> *)local_50,pPVar29->ctAllocator);
    if (pAVar20 == (AltNode *)0x0) {
      return (Node *)0x0;
    }
    if (pAVar20->tail != (AltNode *)0x0) {
      return &pAVar20->super_Node;
    }
    return pAVar20->head;
  }
  pNVar18 = (Node *)new<Memory::ArenaAllocator>(0x68,pPStack_58->ctAllocator,0x366bee);
  *(uint *)&pNVar18->field_0xc = *(uint *)&pNVar18->field_0xc & 0xffff8000;
  pNVar18->tag = MatchSet;
  pNVar18->features = 0;
  pNVar18->firstSet = (CharSet<char16_t> *)0x0;
  pNVar18->followSet = (CharSet<char16_t> *)0x0;
  (pNVar18->prevConsumes).lower = 0;
  *(undefined8 *)&(pNVar18->prevConsumes).upper = 0xffffffff;
  *(undefined8 *)&(pNVar18->thisConsumes).upper = 0xffffffff;
  (pNVar18->followConsumes).upper = 0xffffffff;
  pNVar18->_vptr_Node = (_func_int **)&PTR_LiteralLength_01558fd0;
  *(bool *)&pNVar18[1]._vptr_Node = local_31 == '^';
  *(undefined1 *)((long)&pNVar18[1]._vptr_Node + 1) = 1;
  pNVar32 = &pNVar18[1].tag;
  CharSet<char16_t>::CharSet((CharSet<char16_t> *)pNVar32);
  pAVar24 = pPVar29->ctAllocator;
  goto LAB_00ee08dd;
LAB_00ee0612:
  do {
    lVar2 = *(long *)((long)codePointSet.characterPlanes + lVar27 + -8);
    if (lVar2 - 1U < 5) {
      uVar15 = (int)lVar2 - 1;
    }
    else {
      plVar17 = *(long **)((long)codePointSet.characterPlanes + lVar27 + -8);
      if (plVar17 == (long *)0x0) {
        uVar15 = CharBitvec::Count((CharBitvec *)
                                   ((long)&codePointSet.characterPlanes[0].rep + lVar27));
      }
      else {
        if ((plVar17 != &CharSetFull::Instance) &&
           (uVar26 = (**(code **)(*plVar17 + 0x58))(plVar17,2), 0xff00 < uVar26)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          ppEVar6 = ppEStack_40;
          *(undefined4 *)ppEStack_40 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x252,
                             "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                             ,
                             "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                            );
          if (!bVar8) goto LAB_00ee0c81;
          *(undefined4 *)ppEVar6 = 0;
        }
        uVar15 = CharBitvec::Count((CharBitvec *)
                                   ((long)&codePointSet.characterPlanes[0].rep + lVar27));
        plVar17 = *(long **)((long)codePointSet.characterPlanes + lVar27 + -8);
        if (plVar17 == &CharSetFull::Instance) {
          iVar30 = 0xff00;
        }
        else {
          iVar30 = (**(code **)(*plVar17 + 0x58))(plVar17,2);
        }
        uVar15 = iVar30 + uVar15;
        pPVar29 = pPStack_58;
      }
    }
    uVar14 = uVar14 + uVar15;
    lVar27 = lVar27 + 0x28;
  } while (lVar27 != 0x2a8);
  if (uVar11 != uVar14) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    ppEVar6 = ppEStack_40;
    *(undefined4 *)ppEStack_40 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x8e2,"(codePointSet.SimpleCharCount() == codePointSet.Count())",
                       "codePointSet.SimpleCharCount() == codePointSet.Count()");
    if (!bVar8) {
LAB_00ee0c81:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *(undefined4 *)ppEVar6 = 0;
  }
  pNVar18 = (Node *)new<Memory::ArenaAllocator>(0x68,pPVar29->ctAllocator,0x366bee);
  *(uint *)&pNVar18->field_0xc = *(uint *)&pNVar18->field_0xc & 0xffff8000;
  pNVar18->tag = MatchSet;
  pNVar18->features = 0;
  pNVar18->firstSet = (CharSet<char16_t> *)0x0;
  pNVar18->followSet = (CharSet<char16_t> *)0x0;
  (pNVar18->prevConsumes).lower = 0;
  *(undefined8 *)&(pNVar18->prevConsumes).upper = 0xffffffff;
  *(undefined8 *)&(pNVar18->thisConsumes).upper = 0xffffffff;
  (pNVar18->followConsumes).upper = 0xffffffff;
  pNVar18->_vptr_Node = (_func_int **)&PTR_LiteralLength_01558fd0;
  *(bool *)&pNVar18[1]._vptr_Node = local_31 == '^';
  *(undefined1 *)((long)&pNVar18[1]._vptr_Node + 1) = 1;
  pNVar32 = &pNVar18[1].tag;
  CharSet<char16_t>::CharSet((CharSet<char16_t> *)pNVar32);
  pAVar24 = pPVar29->ctAllocator;
  puVar25 = deferredSetNode.set.rep.full.direct.vec + 6;
LAB_00ee08dd:
  CharSet<unsigned_int>::CloneSimpleCharsTo
            ((CharSet<unsigned_int> *)puVar25,pAVar24,(CharSet<char16_t> *)pNVar32);
  return pNVar18;
}

Assistant:

Node* Parser<P, IsLiteral>::CharacterClassPass1()
    {
        Assert(containsSurrogates ? unicodeFlagPresent : true);

        CharSet<codepoint_t> codePointSet;

        MatchSetNode deferredSetNode(false, false);
        MatchCharNode deferredCharNode(0);

        bool isNegation = false;

        if (ECLookahead() == '^')
        {
            isNegation = true;
            ECConsume();
        }

        // We aren't expecting any terminating null characters, only embedded ones that should treated as valid characters.
        // CharacterClassPass0 should have taken care of terminating null.
        codepoint_t pendingCodePoint = INVALID_CODEPOINT;
        codepoint_t pendingRangeStart = INVALID_CODEPOINT;
        EncodedChar nextChar = ECLookahead();
        bool previousWasASurrogate = false;
        bool currIsACharSet = false;
        bool prevWasACharSetAndPartOfRange = false;
        bool prevprevWasACharSetAndPartOfRange = false;

        while(nextChar != ']')
        {
            codepoint_t codePointToSet = INVALID_CODEPOINT;

            // Consume ahead of time if we have two backslashes, both cases below (previously Tracked surrogate pair, and ClassEscapePass1) assume it is.
            if (nextChar == '\\')
            {
                ECConsume();
            }

            // These if-blocks are the logical ClassAtomPass1, they weren't grouped into a method to simplify dealing with multiple out parameters.
            if (containsSurrogates && this->currentSurrogatePairNode != nullptr && this->currentSurrogatePairNode->location == this->next)
            {
                codePointToSet = pendingCodePoint;

                pendingCodePoint = this->currentSurrogatePairNode->value;
                Assert(ECCanConsume(this->currentSurrogatePairNode->length));
                ECConsumeMultiUnit(this->currentSurrogatePairNode->length);
                this->RestoreMultiUnits(this->currentSurrogatePairNode->multiUnits);
                this->currentSurrogatePairNode = this->currentSurrogatePairNode->next;
            }
            else if (nextChar == '\\')
            {
                Node* returnedNode = ClassEscapePass1(&deferredCharNode, &deferredSetNode, previousWasASurrogate);
                codePointToSet = pendingCodePoint;

                if (returnedNode->tag == Node::MatchSet)
                {
                    if (pendingRangeStart != INVALID_CODEPOINT)
                    {
                        if (unicodeFlagPresent)
                        {
                            //A range containing a character class and the unicode flag is present, thus we end up having to throw a "Syntax" error here
                            //This breaks the notion of Pass0 check for valid syntax, because during that time, the unicode flag is unknown.
                            Fail(JSERR_UnicodeRegExpRangeContainsCharClass); //From #sec-patterns-static-semantics-early-errors-annexb
                        }

                        codePointSet.Set(ctAllocator, '-');
                    }

                    pendingCodePoint = INVALID_CODEPOINT;
                    pendingRangeStart = INVALID_CODEPOINT;
                    codePointSet.UnionInPlace(ctAllocator, deferredSetNode.set);
                    currIsACharSet = true;
                }
                else
                {
                    // Just a character
                    pendingCodePoint = deferredCharNode.cs[0];
                }
            }
            else if (nextChar == '-')
            {
                if (pendingRangeStart != INVALID_CODEPOINT || pendingCodePoint == INVALID_CODEPOINT || ECLookahead(1) == ']')
                {
                    // - is just a char, or end of a range.
                    codePointToSet = pendingCodePoint;
                    pendingCodePoint = '-';
                    ECConsume();
                }
                else
                {
                    pendingRangeStart = pendingCodePoint;
                    ECConsume();
                }
            }
            else
            {
                // Just a character, consume it
                codePointToSet = pendingCodePoint;
                pendingCodePoint = NextChar();
            }

            if (codePointToSet != INVALID_CODEPOINT || prevprevWasACharSetAndPartOfRange)
            {
                if (prevprevWasACharSetAndPartOfRange)
                {
                    //A range containing a character class and the unicode flag is present, thus we end up having to throw a "Syntax" error here
                    //This breaks the notion of Pass0 check for valid syntax, because during that time, the unicode flag is unknown.
                    if (unicodeFlagPresent)
                    {
                        Fail(JSERR_UnicodeRegExpRangeContainsCharClass);
                    }

                    if (pendingCodePoint != INVALID_CODEPOINT)
                    {
                        codePointSet.Set(ctAllocator, pendingCodePoint);
                    }

                    codePointSet.Set(ctAllocator, '-'); //Add '-' to set because a range was detected but turned out to be a union of character set with '-' and another atom.
                    pendingRangeStart = pendingCodePoint = INVALID_CODEPOINT;
                }
                else if (pendingRangeStart != INVALID_CODEPOINT)
                {
                    if (pendingRangeStart > pendingCodePoint)
                    {
                        //We have no unicodeFlag, but current range contains surrogates, thus we may end up having to throw a "Syntax" error here
                        //This breaks the notion of Pass0 check for valid syntax, because we don't know if we have a unicode option
                        Assert(!unicodeFlagPresent);
                        Fail(JSERR_RegExpBadRange);
                    }
                    
                    codePointSet.SetRange(ctAllocator, pendingRangeStart, pendingCodePoint);
                    pendingRangeStart = pendingCodePoint = INVALID_CODEPOINT;
                }
                else
                {
                    codePointSet.Set(ctAllocator, codePointToSet);
                }
            }

            nextChar = ECLookahead();
            prevprevWasACharSetAndPartOfRange = prevWasACharSetAndPartOfRange;
            prevWasACharSetAndPartOfRange = currIsACharSet && nextChar == '-';
            currIsACharSet = false;
        }

        if (pendingCodePoint != INVALID_CODEPOINT)
        {
            codePointSet.Set(ctAllocator, pendingCodePoint);
        }

        // At this point, we have a complete set of codepoints representing the range.
        // Before performing translation of any kind, we need to do some case filling.
        // At the point of this comment, there are no case mappings going cross-plane between simple
        // characters (< 0x10000) and supplementary characters (>= 0x10000)
        // However, it might still be the case, and this has to be handled.

        // On the other hand, we don't want to prevent optimizations that expect non-casefolded sets from happening.
        // At least for simple characters.

        // The simple case, is when the unicode flag isn't specified, we can go ahead and return the simple set.
        // Negations and case mappings will be handled later.
        if (!unicodeFlagPresent)
        {
            Assert(codePointSet.SimpleCharCount() == codePointSet.Count());
            MatchSetNode *simpleToReturn = Anew(ctAllocator, MatchSetNode, isNegation);
            codePointSet.CloneSimpleCharsTo(ctAllocator, simpleToReturn->set);
            return simpleToReturn;
        }

        // Everything past here must be under the flag
        Assert(scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled());

        if (codePointSet.IsEmpty())
        {
            return Anew(ctAllocator, MatchSetNode, false, false);
        }

        Node* prefixNode = nullptr;
        Node* suffixNode = nullptr;

        CharSet<codepoint_t> *toUseForTranslation = &codePointSet;

        // If a singleton, return a simple character
        bool isSingleton = !this->caseInsensitiveFlagPresent && !isNegation && codePointSet.IsSingleton();
        if (isSingleton)
        {
            codepoint_t singleton = codePointSet.Singleton();
            Node* toReturn = nullptr;

            if (singleton < 0x10000)
            {
                toReturn = Anew(ctAllocator, MatchCharNode, (char16)singleton);
            }
            else
            {
                Assert(unicodeFlagPresent);
                char16 lowerSurrogate, upperSurrogate;
                Js::NumberUtilities::CodePointAsSurrogatePair(singleton, &lowerSurrogate, &upperSurrogate);
                toReturn = CreateSurrogatePairAtom(lowerSurrogate, upperSurrogate);
            }

            codePointSet.Clear(ctAllocator);
            return toReturn;
        }

        // If negation, we want to complement the simple chars.
        // When a set is negated, optimizations skip checking if applicable, so we can go ahead and negate it here.
        CharSet<codepoint_t> negatedSet;

        if (!this->caseInsensitiveFlagPresent)
        {
            if (isNegation)
            {
                // Complement all characters, and use it as the set toTranslate
                codePointSet.ToComplement(ctAllocator, negatedSet);
            }

            toUseForTranslation = isNegation ? &negatedSet : &codePointSet;

            if (isNegation)
            {
                // Clear this, as we will no longer need this.
                codePointSet.FreeBody(ctAllocator);
            }
        }
        else
        {
            CharSet<codepoint_t> caseEquivalent;
            codePointSet.ToEquivClass(ctAllocator, caseEquivalent);
            // Equiv set can't have a reduced count of chars
            Assert(caseEquivalent.Count() >= codePointSet.Count());

            // Here we have a regex that has both case insensitive and unicode options.
            // The range might also be negated. If it is negated, we can go ahead and negate
            // the entire set as well as fill in cases, as optimizations wouldn't kick in anyways.
            if (isNegation)
            {
                codePointSet.Clear(ctAllocator);
                caseEquivalent.ToComplement(ctAllocator, codePointSet);
                caseEquivalent.FreeBody(ctAllocator);
            }
            else
            {
                codePointSet.CloneFrom(ctAllocator, caseEquivalent);
            }

            Assert(toUseForTranslation == &codePointSet);
        }

        uint totalCodePointsCount = toUseForTranslation->Count();
        uint simpleCharsCount = toUseForTranslation->SimpleCharCount();
        if (totalCodePointsCount == simpleCharsCount)
        {
            MatchSetNode *simpleToReturn = Anew(ctAllocator, MatchSetNode, isNegation);
            toUseForTranslation->CloneSimpleCharsTo(ctAllocator, simpleToReturn->set);
            return simpleToReturn;
        }

        if  (simpleCharsCount > 0)
        {
            if (!toUseForTranslation->ContainSurrogateCodeUnits())
            {
                MatchSetNode *node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneSimpleCharsTo(ctAllocator, node->set);
                prefixNode = node;
            }
            else
            {
                MatchSetNode *node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneNonSurrogateCodeUnitsTo(ctAllocator, node->set);
                prefixNode = node;
                node = Anew(ctAllocator, MatchSetNode, false, false);
                toUseForTranslation->CloneSurrogateCodeUnitsTo(ctAllocator, node->set);
                suffixNode = node;
            }
        }

        Assert(unicodeFlagPresent);
        AltNode *headToReturn = prefixNode == nullptr ? nullptr : Anew(ctAllocator, AltNode, prefixNode, nullptr);
        AltNode *currentTail = headToReturn;

        codepoint_t charRangeSearchIndex = 0x10000, lowerCharOfRange = 0, upperCharOfRange = 0;

        while (toUseForTranslation->GetNextRange(charRangeSearchIndex, &lowerCharOfRange, &upperCharOfRange))
        {
            if (lowerCharOfRange == upperCharOfRange)
            {
                currentTail = this->AppendSurrogatePairToDisjunction(lowerCharOfRange, currentTail);
            }
            else
            {
                currentTail = this->AppendSurrogateRangeToDisjunction(lowerCharOfRange, upperCharOfRange, currentTail);
            }

            if (headToReturn == nullptr)
            {
                headToReturn = currentTail;
            }

            AnalysisAssert(currentTail != nullptr);
            while (currentTail->tail != nullptr)
            {
                currentTail = currentTail->tail;
            }
            charRangeSearchIndex = upperCharOfRange + 1;
        }

        if (suffixNode != nullptr)
        {
            currentTail->tail = Anew(ctAllocator, AltNode, suffixNode, nullptr);
        }
        toUseForTranslation->Clear(ctAllocator);

        if (headToReturn != nullptr && headToReturn->tail == nullptr)
        {
            return headToReturn->head;
        }
        return headToReturn;
    }